

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

StringRef __thiscall llvm::Twine::toStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  bool bVar1;
  pointer data;
  size_t length;
  SmallVectorImpl<char> *Out_local;
  Twine *this_local;
  
  bVar1 = isSingleStringRef(this);
  if (bVar1) {
    _this_local = getSingleStringRef(this);
  }
  else {
    toVector(this,Out);
    data = SmallVectorTemplateCommon<char,_void>::data((SmallVectorTemplateCommon<char,_void> *)Out)
    ;
    length = SmallVectorBase::size((SmallVectorBase *)Out);
    StringRef::StringRef((StringRef *)&this_local,data,length);
  }
  return _this_local;
}

Assistant:

StringRef toStringRef(SmallVectorImpl<char> &Out) const {
      if (isSingleStringRef())
        return getSingleStringRef();
      toVector(Out);
      return StringRef(Out.data(), Out.size());
    }